

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O2

Status sentencepiece::SentencePieceTrainer::Train
                 (string_view args,SentenceIterator *sentence_iterator,
                 string *serialized_model_proto)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  this;
  string *in_R8;
  NormalizerSpec denormalizer_spec;
  NormalizerSpec normalizer_spec;
  TrainerSpec trainer_spec;
  NormalizerSpec NStack_218;
  NormalizerSpec local_1c8;
  TrainerSpec local_178;
  
  this._M_t.
  super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  ._M_t.
  super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
  .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl =
       (__uniq_ptr_data<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>,_true,_true>
        )args._M_len;
  iVar1 = logging::GetMinLogLevel();
  if (iVar1 < 1) {
    local_178.super_MessageLite._vptr_MessageLite._0_1_ = 0;
    pcVar2 = logging::BaseName("third_party/sentencepiece/src/sentencepiece_trainer.cc");
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar2);
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xb2);
    poVar3 = std::operator<<(poVar3,") ");
    poVar3 = std::operator<<(poVar3,"LOG(");
    poVar3 = std::operator<<(poVar3,"INFO");
    poVar3 = std::operator<<(poVar3,") ");
    poVar3 = std::operator<<(poVar3,"Running command: ");
    std::operator<<(poVar3,(char *)sentence_iterator);
    error::Die::~Die((Die *)&local_178);
  }
  TrainerSpec::TrainerSpec(&local_178);
  NormalizerSpec::NormalizerSpec(&local_1c8);
  NormalizerSpec::NormalizerSpec(&NStack_218);
  MergeSpecsFromArgs(args,(TrainerSpec *)sentence_iterator,(NormalizerSpec *)&local_178,&local_1c8);
  if (*(long *)this._M_t.
               super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
               ._M_t.
               super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
               .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl == 0)
  {
    util::Status::~Status
              ((Status *)
               this._M_t.
               super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
               ._M_t.
               super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
               .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl);
    Train((SentencePieceTrainer *)
          this._M_t.
          super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          ._M_t.
          super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
          .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl,&local_178,
          &local_1c8,&NStack_218,(SentenceIterator *)serialized_model_proto,in_R8);
  }
  NormalizerSpec::~NormalizerSpec(&NStack_218);
  NormalizerSpec::~NormalizerSpec(&local_1c8);
  TrainerSpec::~TrainerSpec(&local_178);
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
}

Assistant:

util::Status SentencePieceTrainer::Train(absl::string_view args,
                                         SentenceIterator *sentence_iterator,
                                         std::string *serialized_model_proto) {
  LOG(INFO) << "Running command: " << args.data();
  TrainerSpec trainer_spec;
  NormalizerSpec normalizer_spec;
  NormalizerSpec denormalizer_spec;
  RETURN_IF_ERROR(MergeSpecsFromArgs(args, &trainer_spec, &normalizer_spec,
                                     &denormalizer_spec));
  return Train(trainer_spec, normalizer_spec, denormalizer_spec,
               sentence_iterator, serialized_model_proto);
}